

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

Node * __thiscall
google::protobuf::Map<int,_proto2_unittest::Proto2MapEnum>::CloneFromOther
          (Map<int,_proto2_unittest::Proto2MapEnum> *this,
          Map<int,_proto2_unittest::Proto2MapEnum> *other)

{
  Node *pNVar1;
  Node *pNVar2;
  NodeBase *pNVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
  uVar5 = (ulong)uVar4;
  if (uVar4 == (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_) {
    uVar5 = 0;
    pNVar3 = (NodeBase *)0x0;
  }
  else {
    pNVar3 = (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar5];
    if (pNVar3 == (NodeBase *)0x0) {
      protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  pNVar1 = (Node *)0x0;
  do {
    do {
      if (pNVar3 == (NodeBase *)0x0) {
        return pNVar1;
      }
      pNVar2 = (Node *)protobuf::internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x10);
      (pNVar2->kv).first = *(int *)&pNVar3[1].next;
      (pNVar2->kv).second = *(Proto2MapEnum *)((long)&pNVar3[1].next + 4);
      (pNVar2->super_KeyNode).super_NodeBase.next = (NodeBase *)pNVar1;
      pNVar3 = pNVar3->next;
      pNVar1 = pNVar2;
    } while (pNVar3 != (NodeBase *)0x0);
    do {
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      if ((other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar4) {
        pNVar3 = (NodeBase *)0x0;
        uVar5 = 0;
        break;
      }
      pNVar3 = (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar4];
    } while (pNVar3 == (NodeBase *)0x0);
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE Node* CloneFromOther(const Map& other) {
    Node* head = nullptr;
    for (const auto& [key, value] : other) {
      Node* new_node;
      if constexpr (std::is_base_of_v<MessageLite, mapped_type>) {
        new_node = CreateNode(key);
        new_node->kv.second = value;
      } else {
        new_node = CreateNode(key, value);
      }
      new_node->next = head;
      head = new_node;
    }
    return head;
  }